

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O0

int fs_storage_path(char *appname,char *path,int max)

{
  char cVar1;
  long lVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  int iVar7;
  char *pcVar8;
  ulong uVar9;
  long in_FS_OFFSET;
  undefined8 uStack_90;
  char local_88 [8];
  undefined8 uStack_80;
  char *local_78;
  ulong local_70;
  char *local_68;
  undefined4 local_5c;
  ulong local_58;
  unsigned_long __vla_expr0;
  char *local_48;
  char *xdgdatahome;
  char *pcStack_38;
  int i;
  char *home;
  char *pcStack_28;
  int max_local;
  char *path_local;
  char *appname_local;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  home._4_4_ = max;
  pcStack_28 = path;
  path_local = appname;
  pcStack_38 = getenv("HOME");
  local_48 = getenv("XDG_DATA_HOME");
  pcVar5 = path_local;
  pcVar4 = pcStack_28;
  pcVar3 = pcStack_38;
  local_58 = (ulong)home._4_4_;
  local_70 = local_58;
  __vla_expr0 = (unsigned_long)local_88;
  lVar2 = -(local_58 + 0xf & 0xfffffffffffffff0);
  local_78 = local_88 + lVar2;
  local_68 = local_78;
  for (pcVar8 = local_88; (long)local_78 < (long)pcVar8; pcVar8 = (char *)((long)pcVar8 + -0x1000))
  {
    *(undefined8 *)pcVar8 = *(undefined8 *)pcVar8;
  }
  if (pcStack_38 == (char *)0x0) {
    appname_local._4_4_ = -1;
  }
  else {
    uVar9 = (ulong)home._4_4_;
    *(undefined8 *)((long)&uStack_90 + lVar2) = 0x256e4a;
    str_format(pcVar4,(int)uVar9,"%s/.%s",pcVar3,pcVar5);
    *(undefined8 *)((long)&uStack_90 + lVar2) = 0x256e53;
    iVar7 = str_length(*(char **)((long)&uStack_90 + lVar2));
    for (xdgdatahome._4_4_ = iVar7 + 2; pcVar6 = path_local, pcVar5 = pcStack_38, pcVar4 = local_48,
        pcVar3 = local_78, pcStack_28[xdgdatahome._4_4_] != '\0';
        xdgdatahome._4_4_ = xdgdatahome._4_4_ + 1) {
      cVar1 = pcStack_28[xdgdatahome._4_4_];
      *(undefined8 *)((long)&uStack_90 + lVar2) = 0x256e78;
      iVar7 = tolower((int)cVar1);
      pcStack_28[xdgdatahome._4_4_] = (char)iVar7;
    }
    if (local_48 == (char *)0x0) {
      uVar9 = (ulong)home._4_4_;
      *(undefined8 *)((long)&uStack_90 + lVar2) = 0x256eb4;
      str_format(pcVar3,(int)uVar9,"%s/.local/share/%s",pcVar5,pcVar6);
      *(undefined8 *)((long)&uStack_90 + lVar2) = 0x256ebd;
      iVar7 = str_length(*(char **)((long)&uStack_90 + lVar2));
      for (xdgdatahome._4_4_ = iVar7 + 0xe; local_78[xdgdatahome._4_4_] != '\0';
          xdgdatahome._4_4_ = xdgdatahome._4_4_ + 1) {
        cVar1 = local_78[xdgdatahome._4_4_];
        *(undefined8 *)((long)&uStack_90 + lVar2) = 0x256ee2;
        iVar7 = tolower((int)cVar1);
        local_78[xdgdatahome._4_4_] = (char)iVar7;
      }
    }
    else {
      uVar9 = (ulong)home._4_4_;
      *(undefined8 *)((long)&uStack_90 + lVar2) = 0x256f1b;
      str_format(pcVar3,(int)uVar9,"%s/%s",pcVar4,pcVar6);
      *(undefined8 *)((long)&uStack_90 + lVar2) = 0x256f24;
      xdgdatahome._4_4_ = str_length(*(char **)((long)&uStack_90 + lVar2));
      while (xdgdatahome._4_4_ = xdgdatahome._4_4_ + 1, local_78[xdgdatahome._4_4_] != '\0') {
        cVar1 = local_78[xdgdatahome._4_4_];
        *(undefined8 *)((long)&uStack_90 + lVar2) = 0x256f49;
        iVar7 = tolower((int)cVar1);
        local_78[xdgdatahome._4_4_] = (char)iVar7;
      }
    }
    *(undefined8 *)((long)&uStack_90 + lVar2) = 0x256f6e;
    iVar7 = fs_is_dir(*(char **)((long)&uStack_80 + lVar2));
    pcVar4 = pcStack_28;
    pcVar3 = local_78;
    if (iVar7 == 0) {
      uVar9 = (ulong)home._4_4_;
      *(undefined8 *)((long)&uStack_90 + lVar2) = 0x256f9c;
      str_format(pcVar4,(int)uVar9,"%s",pcVar3);
      appname_local._4_4_ = 0;
    }
    else {
      appname_local._4_4_ = 0;
    }
  }
  local_5c = 1;
  uStack_80._4_4_ = appname_local._4_4_;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_10) {
    *(undefined **)(__vla_expr0 - 8) = &UNK_00256fd6;
    __stack_chk_fail();
  }
  return appname_local._4_4_;
}

Assistant:

int fs_storage_path(const char *appname, char *path, int max)
{
#if defined(CONF_FAMILY_WINDOWS)
	WCHAR *home = _wgetenv(L"APPDATA");
	char buffer[IO_MAX_PATH_LENGTH];
	if(!home)
		return -1;
	WideCharToMultiByte(CP_UTF8, 0, home, -1, buffer, sizeof(buffer), NULL, NULL);
	str_format(path, max, "%s/%s", buffer, appname);
	return 0;
#else
	char *home = getenv("HOME");
	int i;
	char *xdgdatahome = getenv("XDG_DATA_HOME");
	char xdgpath[max];

	if(!home)
		return -1;

#if defined(CONF_PLATFORM_MACOSX)
	str_format(path, max, "%s/Library/Application Support/%s", home, appname);
	return 0;
#endif

	/* old folder location */
	str_format(path, max, "%s/.%s", home, appname);
	for(i = str_length(home)+2; path[i]; i++)
		path[i] = tolower(path[i]);

	if(!xdgdatahome)
	{
		/* use default location */
		str_format(xdgpath, max, "%s/.local/share/%s", home, appname);
		for(i = str_length(home)+14; xdgpath[i]; i++)
			xdgpath[i] = tolower(xdgpath[i]);
	}
	else
	{
		str_format(xdgpath, max, "%s/%s", xdgdatahome, appname);
		for(i = str_length(xdgdatahome)+1; xdgpath[i]; i++)
			xdgpath[i] = tolower(xdgpath[i]);
	}

	/* check for old location / backward compatibility */
	if(fs_is_dir(path))
	{
		/* use old folder path */
		/* for backward compatibility */
		return 0;
	}

	str_format(path, max, "%s", xdgpath);

	return 0;
#endif
}